

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockExpectedCall::~TEST_GROUP_CppUTestGroupMockExpectedCall
          (TEST_GROUP_CppUTestGroupMockExpectedCall *this)

{
  TEST_GROUP_CppUTestGroupMockExpectedCall *this_local;
  
  ~TEST_GROUP_CppUTestGroupMockExpectedCall(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_GROUP(MockExpectedCall)
{
    MockCheckedExpectedCall* call;
    MockNamedValueComparatorsAndCopiersRepository* originalComparatorRepository;
    void setup() _override
    {
        originalComparatorRepository = MockNamedValue::getDefaultComparatorsAndCopiersRepository();
        call = new MockCheckedExpectedCall(1);
        call->withName("funcName");
    }
    void teardown() _override
    {
        MockNamedValue::setDefaultComparatorsAndCopiersRepository(originalComparatorRepository);
        delete call;
        CHECK_NO_MOCK_FAILURE();
        MockFailureReporterForTest::clearReporter();
    }
}